

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

void __thiscall
highwayhash::HighwayHashCatTest<1U>::operator()
          (HighwayHashCatTest<1U> *this,HHKey *key,char *bytes,uint64_t size,HHResult64 *expected,
          HHNotify notify)

{
  unsigned_long *puVar1;
  ulong uVar2;
  size_t num_bytes;
  unsigned_long *puVar3;
  unsigned_long *expected_00;
  size_t i;
  size_t sVar4;
  size_t size3;
  size_t num_bytes_00;
  unsigned_long result_cat;
  HHStateT<1> state_flat;
  unsigned_long *local_188;
  size_t local_170;
  unsigned_long local_148;
  HighwayHashCatT<1U> local_140;
  
  puVar1 = (unsigned_long *)operator_new__(-(ulong)(size + 1 >> 0x3d != 0) | size * 8 + 8);
  puVar3 = puVar1;
  for (sVar4 = 0; sVar4 <= size; sVar4 = sVar4 + 1) {
    Portable::HHStatePortable::Reset((HHStatePortable *)&local_140,*key);
    HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              ((HHStatePortable *)&local_140,bytes,sVar4,puVar3);
    puVar3 = puVar3 + 1;
  }
  uVar2 = size / 3;
  local_188 = puVar1;
  for (sVar4 = 0; sVar4 != uVar2; sVar4 = sVar4 + 1) {
    puVar3 = local_188;
    local_170 = sVar4;
    for (num_bytes = 0; num_bytes != uVar2; num_bytes = num_bytes + 1) {
      expected_00 = puVar3;
      for (num_bytes_00 = 0; uVar2 != num_bytes_00; num_bytes_00 = num_bytes_00 + 1) {
        HighwayHashCatT<1U>::HighwayHashCatT(&local_140,key);
        HighwayHashCatT<1U>::Append(&local_140,bytes,sVar4);
        HighwayHashCatT<1U>::Append(&local_140,bytes + sVar4,num_bytes);
        HighwayHashCatT<1U>::Append(&local_140,bytes + sVar4 + num_bytes,num_bytes_00);
        HighwayHashCatT<1U>::Finalize<unsigned_long>(&local_140,&local_148);
        anon_unknown_5::NotifyIfUnequal(local_170 + num_bytes_00,expected_00,&local_148,notify);
        expected_00 = expected_00 + 1;
      }
      local_170 = local_170 + 1;
      puVar3 = puVar3 + 1;
    }
    local_188 = local_188 + 1;
  }
  operator_delete__(puVar1);
  return;
}

Assistant:

void HighwayHashCatTest<Target>::operator()(const HHKey& key,
                                            const char* HH_RESTRICT bytes,
                                            const uint64_t size,
                                            const HHResult64* expected,
                                            const HHNotify notify) const {
  TestHighwayHashCat(key, bytes, size, expected, notify);
}